

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     call_func<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept,bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
               (_func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **param_1
               ,Function_Params *param_2,Function_Params *param_3,Type_Conversions_State *param_4)

{
  Boxed_Value *pBVar1;
  byte bVar2;
  Boxed_Value *bv;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_40;
  Type_Conversions_State *local_30;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **f_local;
  _func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr *param_0_local;
  
  pBVar1 = param_2->m_begin;
  local_30 = param_4;
  t_conversions_local = (Type_Conversions_State *)param_3;
  params_local = param_2;
  f_local = param_1;
  bv = Function_Params::operator[](param_3,0);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            ((chaiscript *)&local_40,bv,local_30);
  bVar2 = (*(code *)pBVar1)(&local_40);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_40);
  return (bool)(bVar2 & 1);
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }